

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::AllowUnknownDependenciesTest_CustomOption_Test::TestBody
          (AllowUnknownDependenciesTest_CustomOption_Test *this)

{
  bool bVar1;
  FileDescriptor *pFVar2;
  uint uVar3;
  Message *in_RCX;
  char *pcVar4;
  char *in_R9;
  pointer *__ptr;
  Metadata MVar5;
  string_view input;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  FileDescriptorProto option_proto;
  AssertHelper local_160;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_150;
  undefined1 local_148 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  undefined1 local_128 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_120;
  pointer local_118;
  AssertHelper local_110;
  FileDescriptorProto local_108;
  
  FileDescriptorProto::FileDescriptorProto(&local_108,(Arena *)0x0);
  input._M_str = (char *)&local_108;
  input._M_len = (size_t)
                 "name: \"unknown_custom_options.proto\" dependency: \"google/protobuf/descriptor.proto\" extension {   extendee: \"google.protobuf.FileOptions\"   name: \"some_option\"   number: 123456   label: LABEL_OPTIONAL   type: TYPE_INT32 } options {   uninterpreted_option {     name {       name_part: \"some_option\"       is_extension: true     }     positive_int_value: 1234   }   uninterpreted_option {     name {       name_part: \"unknown_option\"       is_extension: true     }     positive_int_value: 1234   }   uninterpreted_option {     name {       name_part: \"optimize_for\"       is_extension: false     }     identifier_value: \"SPEED\"   } }"
  ;
  bVar1 = TextFormat::ParseFromString((TextFormat *)0x278,input,in_RCX);
  local_128[0] = bVar1;
  pbStack_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    pFVar2 = AllowUnknownDependenciesTest::BuildFile
                       (&this->super_AllowUnknownDependenciesTest,&local_108);
    local_128[0] = pFVar2 != (FileDescriptor *)0x0;
    pbStack_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (pFVar2 != (FileDescriptor *)0x0) {
      local_128 = (undefined1  [8])0x0;
      pbStack_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_118 = (pointer)0x0;
      MVar5 = FileOptions::GetMetadata((FileOptions *)_FileOptions_default_instance_);
      Reflection::ListFields
                (MVar5.reflection,&pFVar2->options_->super_Message,
                 (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  *)local_128);
      local_160.data_._0_4_ = 2;
      local_158._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)pbStack_120 - (long)local_128 >> 3);
      testing::internal::CmpHelperEQ<int,unsigned_long>
                ((internal *)local_148,"2","fields.size()",(int *)&local_160,
                 (unsigned_long *)&local_158);
      if (local_148[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_158);
        if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar4 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar4 = (local_140->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_160,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0xeba,pcVar4);
        testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_158);
LAB_005a0d33:
        testing::internal::AssertHelper::~AssertHelper(&local_160);
        if (local_158._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_158._M_head_impl + 8))();
        }
      }
      else {
        if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_140,local_140);
        }
        uVar3 = (pFVar2->options_->field_0)._impl_._has_bits_.has_bits_[0] & 0x40000;
        local_158._M_head_impl._0_1_ = (char)(uVar3 >> 0x12);
        local_150 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (uVar3 == 0) {
          testing::Message::Message((Message *)&local_160);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_148,(internal *)&local_158,
                     (AssertionResult *)"file->options().has_optimize_for()","false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_110,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0xebb,(char *)CONCAT71(local_148._1_7_,local_148[0]));
          testing::internal::AssertHelper::operator=(&local_110,(Message *)&local_160);
          testing::internal::AssertHelper::~AssertHelper(&local_110);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_148._1_7_,local_148[0]) != &local_138) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT71(local_148._1_7_,local_148[0]),
                            local_138._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT44(local_160.data_._4_4_,local_160.data_._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_160.data_._4_4_,local_160.data_._0_4_) + 8))();
          }
          if (local_150 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_150,local_150);
          }
        }
        local_158._M_head_impl._0_4_ = 2;
        local_160.data_._0_4_ = *(undefined4 *)((long)&pFVar2->options_->field_0 + 0x28);
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_148,"2","file->options().uninterpreted_option_size()",
                   (int *)&local_158,(int *)&local_160);
        if (local_148[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_158);
          if (local_140 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar4 = anon_var_dwarf_a22956 + 5;
          }
          else {
            pcVar4 = (local_140->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_160,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0xebc,pcVar4);
          testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_158);
          goto LAB_005a0d33;
        }
      }
      if (local_140 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_140,local_140);
      }
      if (local_128 != (undefined1  [8])0x0) {
        operator_delete((void *)local_128,(long)local_118 - (long)local_128);
      }
      goto LAB_005a0d78;
    }
    testing::Message::Message((Message *)&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_148,(internal *)local_128,(AssertionResult *)0x10b0e05,"false","true"
               ,in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xeb4,(char *)CONCAT71(local_148._1_7_,local_148[0]));
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_158);
  }
  else {
    testing::Message::Message((Message *)&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_148,(internal *)local_128,
               (AssertionResult *)
               "TextFormat::ParseFromString( \"name: \\\"unknown_custom_options.proto\\\" \" \"dependency: \\\"google/protobuf/descriptor.proto\\\" \" \"extension { \" \"  extendee: \\\"google.protobuf.FileOptions\\\" \" \"  name: \\\"some_option\\\" \" \"  number: 123456 \" \"  label: LABEL_OPTIONAL \" \"  type: TYPE_INT32 \" \"} \" \"options { \" \"  uninterpreted_option { \" \"    name { \" \"      name_part: \\\"some_option\\\" \" \"      is_extension: true \" \"    } \" \"    positive_int_value: 1234 \" \"  } \" \"  uninterpreted_option { \" \"    name { \" \"      name_part: \\\"unknown_option\\\" \" \"      is_extension: true \" \"    } \" \"    positive_int_value: 1234 \" \"  } \" \"  uninterpreted_option { \" \"    name { \" \"      name_part: \\\"optimize_for\\\" \" \"      is_extension: false \" \"    } \" \"    identifier_value: \\\"SPEED\\\" \" \"  } \" \"}\", &option_proto)"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0xeb1,(char *)CONCAT71(local_148._1_7_,local_148[0]));
    testing::internal::AssertHelper::operator=(&local_160,(Message *)&local_158);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_160);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_148._1_7_,local_148[0]) != &local_138) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_148._1_7_,local_148[0]),local_138._M_allocated_capacity + 1);
  }
  if (local_158._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_158._M_head_impl + 8))();
  }
  if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_120,pbStack_120);
  }
LAB_005a0d78:
  FileDescriptorProto::~FileDescriptorProto(&local_108);
  return;
}

Assistant:

TEST_P(AllowUnknownDependenciesTest, CustomOption) {
  // Test that we can use a custom option without having parsed
  // descriptor.proto.

  FileDescriptorProto option_proto;

  ASSERT_TRUE(TextFormat::ParseFromString(
      "name: \"unknown_custom_options.proto\" "
      "dependency: \"google/protobuf/descriptor.proto\" "
      "extension { "
      "  extendee: \"google.protobuf.FileOptions\" "
      "  name: \"some_option\" "
      "  number: 123456 "
      "  label: LABEL_OPTIONAL "
      "  type: TYPE_INT32 "
      "} "
      "options { "
      "  uninterpreted_option { "
      "    name { "
      "      name_part: \"some_option\" "
      "      is_extension: true "
      "    } "
      "    positive_int_value: 1234 "
      "  } "
      "  uninterpreted_option { "
      "    name { "
      "      name_part: \"unknown_option\" "
      "      is_extension: true "
      "    } "
      "    positive_int_value: 1234 "
      "  } "
      "  uninterpreted_option { "
      "    name { "
      "      name_part: \"optimize_for\" "
      "      is_extension: false "
      "    } "
      "    identifier_value: \"SPEED\" "
      "  } "
      "}",
      &option_proto));

  const FileDescriptor* file = BuildFile(option_proto);
  ASSERT_TRUE(file != nullptr);

  // Verify that no extension options were set, but they were left as
  // uninterpreted_options.
  std::vector<const FieldDescriptor*> fields;
  file->options().GetReflection()->ListFields(file->options(), &fields);
  ASSERT_EQ(2, fields.size());
  EXPECT_TRUE(file->options().has_optimize_for());
  EXPECT_EQ(2, file->options().uninterpreted_option_size());
}